

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cf95::Environment::RandomNewFree(Environment *this,BitGen *gen,size_t min_index)

{
  shared_ptr<const_upb::Arena> *psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  enable_if_t<_std::is_same<unsigned_long,_void>::value,_unsigned_long> eVar4;
  MutexLock local_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  std::make_shared<upb::Arena_const>();
  eVar4 = absl::lts_20250127::
          Uniform<unsigned_long,absl::lts_20250127::random_internal::NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,absl::lts_20250127::random_internal::RandenPoolSeedSeq>&>
                    (gen,min_index,100);
  local_30.mu_ = &this->mutex_;
  absl::lts_20250127::Mutex::Lock(local_30.mu_);
  psVar1 = (this->arenas_)._M_elems + eVar4;
  peVar2 = (psVar1->super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (psVar1->super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  psVar1 = (this->arenas_)._M_elems + eVar4;
  (psVar1->super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_28;
  (psVar1->super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Stack_20._M_pi;
  local_28 = peVar2;
  _Stack_20._M_pi = p_Var3;
  absl::lts_20250127::MutexLock::~MutexLock(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  return;
}

Assistant:

void RandomNewFree(absl::BitGen& gen, size_t min_index = 0) {
    auto a = std::make_shared<const upb::Arena>();
    SwapRandomArena(gen, a, min_index);
  }